

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

void __thiscall
ot::commissioner::JoinerSession::RelaySocket::RelaySocket
          (RelaySocket *this,JoinerSession *aJoinerSession,Address *aPeerAddr,uint16_t aPeerPort,
          Address *aLocalAddr,uint16_t aLocalPort)

{
  int iVar1;
  event_base *aEventBase;
  int fail;
  uint16_t aLocalPort_local;
  Address *aLocalAddr_local;
  uint16_t aPeerPort_local;
  Address *aPeerAddr_local;
  JoinerSession *aJoinerSession_local;
  RelaySocket *this_local;
  
  aEventBase = CommissionerImpl::GetEventBase(aJoinerSession->mCommImpl);
  Socket::Socket(&this->super_Socket,aEventBase);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RelaySocket_003ef520;
  this->mJoinerSession = aJoinerSession;
  Address::Address(&this->mPeerAddr,aPeerAddr);
  this->mPeerPort = aPeerPort;
  Address::Address(&this->mLocalAddr,aLocalAddr);
  this->mLocalPort = aLocalPort;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mRecvBuf);
  (this->super_Socket).mIsConnected = true;
  iVar1 = event_assign(&(this->super_Socket).mEvent,(this->super_Socket).mEventBase,-1,0x10,
                       Socket::HandleEvent,this);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = event_add(&(this->super_Socket).mEvent,(timeval *)0x0);
  if (iVar1 != 0) {
    abort();
  }
  return;
}

Assistant:

JoinerSession::RelaySocket::RelaySocket(JoinerSession &aJoinerSession,
                                        const Address &aPeerAddr,
                                        uint16_t       aPeerPort,
                                        const Address &aLocalAddr,
                                        uint16_t       aLocalPort)
    : Socket(aJoinerSession.mCommImpl.GetEventBase())
    , mJoinerSession(aJoinerSession)
    , mPeerAddr(aPeerAddr)
    , mPeerPort(aPeerPort)
    , mLocalAddr(aLocalAddr)
    , mLocalPort(aLocalPort)
{
    int fail;

    mIsConnected = true;

    fail = event_assign(&mEvent, mEventBase, -1, EV_PERSIST, HandleEvent, this);
    VerifyOrDie(fail == 0);
    VerifyOrDie((fail = event_add(&mEvent, nullptr)) == 0);
}